

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall
spirv_cross::Compiler::inherit_expression_dependencies
          (Compiler *this,uint32_t dst,uint32_t source_expression)

{
  _Hash_node_base *p_Var1;
  Variant *pVVar2;
  size_t sVar3;
  TypedID<(spirv_cross::Types)0> *insert_begin;
  long lVar4;
  SPIRExpression *pSVar5;
  SPIRVariable *pSVar6;
  SPIRExpression *pSVar7;
  TypedID<(spirv_cross::Types)0> *pTVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *this_00;
  
  uVar9 = (ulong)dst;
  uVar11 = (this->forwarded_temporaries)._M_h._M_bucket_count;
  uVar10 = uVar9 % uVar11;
  p_Var12 = (this->forwarded_temporaries)._M_h._M_buckets[uVar10];
  p_Var13 = (__node_base_ptr)0x0;
  if ((p_Var12 != (__node_base_ptr)0x0) &&
     (p_Var1 = p_Var12->_M_nxt, p_Var13 = p_Var12, *(uint32_t *)&p_Var12->_M_nxt[1]._M_nxt != dst))
  {
    while (p_Var12 = p_Var1, p_Var1 = p_Var12->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
      p_Var13 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var1[1]._M_nxt % uVar11 != uVar10) ||
         (p_Var13 = p_Var12, *(uint *)&p_Var1[1]._M_nxt == dst)) goto LAB_002c8525;
    }
    p_Var13 = (__node_base_ptr)0x0;
  }
LAB_002c8525:
  if ((p_Var13 != (__node_base_ptr)0x0) && (p_Var13->_M_nxt != (_Hash_node_base *)0x0)) {
    uVar11 = (this->forced_temporaries)._M_h._M_bucket_count;
    uVar10 = uVar9 % uVar11;
    p_Var12 = (this->forced_temporaries)._M_h._M_buckets[uVar10];
    p_Var13 = (__node_base_ptr)0x0;
    if ((p_Var12 != (__node_base_ptr)0x0) &&
       (p_Var1 = p_Var12->_M_nxt, p_Var13 = p_Var12, *(uint32_t *)&p_Var12->_M_nxt[1]._M_nxt != dst)
       ) {
      while (p_Var12 = p_Var1, p_Var1 = p_Var12->_M_nxt, p_Var1 != (_Hash_node_base *)0x0) {
        p_Var13 = (__node_base_ptr)0x0;
        if (((ulong)*(uint *)&p_Var1[1]._M_nxt % uVar11 != uVar10) ||
           (p_Var13 = p_Var12, *(uint *)&p_Var1[1]._M_nxt == dst)) goto LAB_002c8597;
      }
      p_Var13 = (__node_base_ptr)0x0;
    }
LAB_002c8597:
    if ((p_Var13 == (__node_base_ptr)0x0) || (p_Var13->_M_nxt == (_Hash_node_base *)0x0)) {
      pSVar5 = Variant::get<spirv_cross::SPIRExpression>
                         ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar9);
      uVar11 = (ulong)source_expression;
      if ((uVar11 < (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar2 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
         pVVar2[uVar11].type == TypeVariable)) {
        pSVar6 = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + uVar11);
      }
      else {
        pSVar6 = (SPIRVariable *)0x0;
      }
      if ((pSVar6 != (SPIRVariable *)0x0) && (pSVar6->phi_variable == true)) {
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::reserve
                  (&pSVar6->dependees,
                   (pSVar6->dependees).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size + 1);
        sVar3 = (pSVar6->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
                buffer_size;
        (pSVar6->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr
        [sVar3].id = dst;
        (pSVar6->dependees).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
        buffer_size = sVar3 + 1;
      }
      if (uVar11 < (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size) {
        pVVar2 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
        if (pVVar2[uVar11].type == TypeExpression) {
          pSVar7 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + uVar11);
        }
        else {
          pSVar7 = (SPIRExpression *)0x0;
        }
      }
      else {
        pSVar7 = (SPIRExpression *)0x0;
      }
      if (pSVar7 != (SPIRExpression *)0x0) {
        this_00 = &pSVar5->expression_dependencies;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::reserve
                  (this_00,(pSVar5->expression_dependencies).
                           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
                           buffer_size + 1);
        sVar3 = (pSVar5->expression_dependencies).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
        pTVar8 = (pSVar5->expression_dependencies).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr + sVar3;
        pTVar8->id = source_expression;
        (pSVar5->expression_dependencies).
        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size = sVar3 + 1;
        insert_begin = (pSVar7->expression_dependencies).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::insert
                  (this_00,pTVar8 + 1,insert_begin,
                   insert_begin +
                   (pSVar7->expression_dependencies).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size);
        uVar11 = (pSVar5->expression_dependencies).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
        if (uVar11 != 0) {
          pTVar8 = (this_00->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>).ptr;
          lVar4 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar4 == 0; lVar4 = lVar4 + -1) {
            }
          }
          ::std::
          __introsort_loop<spirv_cross::TypedID<(spirv_cross::Types)0>*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (pTVar8,pTVar8 + uVar11,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
          ::std::
          __final_insertion_sort<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_less_iter>
                    (pTVar8,pTVar8 + uVar11);
        }
        pTVar8 = (pSVar5->expression_dependencies).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
        pTVar8 = ::std::
                 __unique<spirv_cross::TypedID<(spirv_cross::Types)0>*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (pTVar8,pTVar8 + (pSVar5->expression_dependencies).
                                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>
                                            .buffer_size);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL>::erase
                  (this_00,pTVar8,
                   (pSVar5->expression_dependencies).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr +
                   (pSVar5->expression_dependencies).
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size);
        return;
      }
    }
  }
  return;
}

Assistant:

void Compiler::inherit_expression_dependencies(uint32_t dst, uint32_t source_expression)
{
	// Don't inherit any expression dependencies if the expression in dst
	// is not a forwarded temporary.
	if (forwarded_temporaries.find(dst) == end(forwarded_temporaries) ||
	    forced_temporaries.find(dst) != end(forced_temporaries))
	{
		return;
	}

	auto &e = get<SPIRExpression>(dst);
	auto *phi = maybe_get<SPIRVariable>(source_expression);
	if (phi && phi->phi_variable)
	{
		// We have used a phi variable, which can change at the end of the block,
		// so make sure we take a dependency on this phi variable.
		phi->dependees.push_back(dst);
	}

	auto *s = maybe_get<SPIRExpression>(source_expression);
	if (!s)
		return;

	auto &e_deps = e.expression_dependencies;
	auto &s_deps = s->expression_dependencies;

	// If we depend on a expression, we also depend on all sub-dependencies from source.
	e_deps.push_back(source_expression);
	e_deps.insert(end(e_deps), begin(s_deps), end(s_deps));

	// Eliminate duplicated dependencies.
	sort(begin(e_deps), end(e_deps));
	e_deps.erase(unique(begin(e_deps), end(e_deps)), end(e_deps));
}